

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

ostream * glu::decl::operator<<(ostream *str,DeclareVariable *decl)

{
  Type TVar1;
  Precision precision;
  int iVar2;
  StructType *pSVar3;
  ostream *poVar4;
  char *pcVar5;
  DeclareVariable *pDVar6;
  pointer piVar7;
  vector<int,_std::allocator<int>_> arraySizes;
  _Vector_base<int,_std::allocator<int>_> local_58;
  DeclareStructTypePtr local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  for (pDVar6 = decl; TVar1 = (pDVar6->varType).m_type, TVar1 == TYPE_ARRAY;
      pDVar6 = (DeclareVariable *)(pDVar6->varType).m_data.array.elementType) {
    local_40.structPtr =
         (StructType *)CONCAT44(local_40.structPtr._4_4_,(pDVar6->varType).m_data.array.size);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_58,(int *)&local_40);
  }
  if (TVar1 == TYPE_BASIC) {
    precision = (pDVar6->varType).m_data.basic.precision;
    if (precision != PRECISION_LAST) {
      pcVar5 = getPrecisionName(precision);
      poVar4 = std::operator<<(str,pcVar5);
      std::operator<<(poVar4," ");
    }
    pcVar5 = getDataTypeName((pDVar6->varType).m_data.basic.type);
    std::operator<<(str,pcVar5);
  }
  else if (TVar1 == TYPE_STRUCT) {
    pSVar3 = (pDVar6->varType).m_data.structPtr;
    if ((pSVar3->m_typeName)._M_string_length == 0) {
      local_40.indentLevel = decl->indentLevel;
      local_40.structPtr = pSVar3;
      operator<<(str,&local_40);
    }
    else {
      std::operator<<(str,(pSVar3->m_typeName)._M_dataplus._M_p);
    }
  }
  poVar4 = std::operator<<(str," ");
  std::operator<<(poVar4,(string *)&decl->name);
  for (piVar7 = local_58._M_impl.super__Vector_impl_data._M_start;
      piVar7 != local_58._M_impl.super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
    iVar2 = *piVar7;
    pcVar5 = "[]";
    poVar4 = str;
    if (iVar2 != -1) {
      poVar4 = std::operator<<(str,"[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      pcVar5 = "]";
    }
    std::operator<<(poVar4,pcVar5);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DeclareVariable& decl)
{
	const VarType&		type	= decl.varType;
	const VarType*		curType	= &type;
	std::vector<int>	arraySizes;

	// Handle arrays.
	while (curType->isArrayType())
	{
		arraySizes.push_back(curType->getArraySize());
		curType = &curType->getElementType();
	}

	if (curType->isBasicType())
	{
		if (curType->getPrecision() != PRECISION_LAST)
			str << glu::getPrecisionName(curType->getPrecision()) << " ";
		str << glu::getDataTypeName(curType->getBasicType());
	}
	else if (curType->isStructType())
	{
		const StructType* structPtr = curType->getStructPtr();

		if (structPtr->hasTypeName())
			str << structPtr->getTypeName();
		else
			str << declare(structPtr, decl.indentLevel); // Generate inline declaration.
	}
	else
		DE_ASSERT(false);

	str << " " << decl.name;

	// Print array sizes.
	for (std::vector<int>::const_iterator sizeIter = arraySizes.begin(); sizeIter != arraySizes.end(); sizeIter++)
	{
		const int arrSize = *sizeIter;
		if (arrSize == VarType::UNSIZED_ARRAY)
			str << "[]";
		else
			str << "[" << arrSize << "]";
	}

	return str;
}